

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

uchar * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateArrayZ<unsigned_char>
          (SlabAllocatorBase<0> *this,size_t count)

{
  size_t size;
  uchar *res;
  size_t count_local;
  SlabAllocatorBase<0> *this_local;
  
  if (count < 0x1001) {
    size = (size_t)SlabAllocateRawSize<true,true>(this,count);
  }
  else {
    size = (size_t)SlabAllocateLargeBlockSize<true>(this,count);
  }
  memset((void *)size,0,count);
  return (uchar *)size;
}

Assistant:

T* SlabAllocateArrayZ(size_t count)
        {
            T* res = nullptr;

            size_t size = count * sizeof(T);
            if (size <= TTD_SLAB_LARGE_BLOCK_SIZE)
            {
                res = (T*)this->SlabAllocateRawSize<true, true>(size);
            }
            else
            {
                res = (T*)this->SlabAllocateLargeBlockSize<true>(size);
            }

            memset(res, 0, size);
            return res;
        }